

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

string * chaiscript::ChaiScript_Basic::load_file(string *__return_storage_ptr__,string *t_filename)

{
  char cVar1;
  bool bVar2;
  ulong __n;
  file_not_found_error *this;
  vector<char,_std::allocator<char>_> v;
  ifstream infile;
  allocator_type local_239;
  vector<char,_std::allocator<char>_> local_238;
  ifstream local_220 [520];
  
  std::ifstream::ifstream(local_220,(t_filename->_M_dataplus)._M_p,_S_in|_S_bin|_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    this = (file_not_found_error *)__cxa_allocate_exception(0x30);
    exception::file_not_found_error::file_not_found_error(this,t_filename);
    __cxa_throw(this,&exception::file_not_found_error::typeinfo,
                exception::file_not_found_error::~file_not_found_error);
  }
  __n = std::istream::tellg();
  std::istream::seekg((long)local_220,_S_beg);
  if (-1 < (long)__n) {
    bVar2 = skip_bom(local_220);
    if (bVar2) {
      if (__n < 3) {
        __assert_fail("size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_engine.hpp"
                      ,0xda,
                      "static std::string chaiscript::ChaiScript_Basic::load_file(const std::string &)"
                     );
      }
      __n = __n - 3;
    }
    if (__n == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector(&local_238,__n,&local_239);
      std::istream::read((char *)local_220,
                         (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)__return_storage_ptr__,
                 local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    std::ifstream::~ifstream(local_220);
    return __return_storage_ptr__;
  }
  __assert_fail("size >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_engine.hpp"
                ,0xd6,
                "static std::string chaiscript::ChaiScript_Basic::load_file(const std::string &)");
}

Assistant:

static std::string load_file(const std::string &t_filename) {
      std::ifstream infile(t_filename.c_str(), std::ios::in | std::ios::ate | std::ios::binary);

      if (!infile.is_open()) {
        throw chaiscript::exception::file_not_found_error(t_filename);
      }

      auto size = infile.tellg();
      infile.seekg(0, std::ios::beg);

      assert(size >= 0);

      if (skip_bom(infile)) {
        size -= 3; // decrement the BOM size from file size, otherwise we'll get parsing errors
        assert(size >= 0); // and check if there's more text
      }

      if (size == std::streampos(0)) {
        return std::string();
      } else {
        std::vector<char> v(static_cast<size_t>(size));
        infile.read(&v[0], static_cast<std::streamsize>(size));
        return std::string(v.begin(), v.end());
      }
    }